

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O2

Result __thiscall
QPanGestureRecognizer::recognize
          (QPanGestureRecognizer *this,QGesture *state,QObject *param_2,QEvent *event)

{
  short sVar1;
  long lVar2;
  GestureState GVar3;
  QFlagsStorage<QGestureRecognizer::ResultFlag> QVar4;
  long in_FS_OFFSET;
  double dVar5;
  QPointF QVar6;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&state->field_0x8;
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0xc4) {
    GVar3 = QGesture::state(state);
    if (GVar3 == NoGesture) {
      QVar4.i = 0x10;
    }
    else {
      QVar4.i = 8;
      if (*(long *)(event + 0x38) == (long)*(int *)(lVar2 + 0xe8)) {
        *(undefined8 *)(lVar2 + 0xa8) = *(undefined8 *)(lVar2 + 0xb8);
        *(undefined8 *)(lVar2 + 0xb0) = *(undefined8 *)(lVar2 + 0xc0);
        QVar6 = panOffset((QList<QEventPoint> *)(event + 0x28),*(int *)(lVar2 + 0xe8));
        *(QPointF *)(lVar2 + 0xb8) = QVar6;
      }
    }
    goto LAB_002eb935;
  }
  QVar4.i = 1;
  if (sVar1 == 0xc3) {
    if (*(long *)(event + 0x38) < (long)*(int *)(lVar2 + 0xe8)) goto LAB_002eb935;
    *(undefined8 *)(lVar2 + 0xa8) = *(undefined8 *)(lVar2 + 0xb8);
    *(undefined8 *)(lVar2 + 0xb0) = *(undefined8 *)(lVar2 + 0xc0);
    QVar6 = panOffset((QList<QEventPoint> *)(event + 0x28),*(int *)(lVar2 + 0xe8));
    dVar5 = QVar6.yp;
    *(QPointF *)(lVar2 + 0xb8) = QVar6;
    if ((((10.0 < QVar6.xp) || (dVar5 < -10.0)) || (QVar6.xp < -10.0)) || (10.0 < dVar5)) {
      local_38.xp = (qreal)QEventPoint::globalPressPosition();
      local_38.yp = dVar5;
      QGesture::setHotSpot(state,&local_38);
      QVar4.i = 4;
      goto LAB_002eb935;
    }
  }
  else {
    if (sVar1 != 0xc2) goto LAB_002eb935;
    *(undefined8 *)(lVar2 + 0xb8) = 0;
    *(undefined8 *)(lVar2 + 0xc0) = 0;
    *(undefined8 *)(lVar2 + 0xa8) = 0;
    *(undefined8 *)(lVar2 + 0xb0) = 0;
    *(int *)(lVar2 + 0xe8) = this->m_pointCount;
  }
  QVar4.i = 2;
LAB_002eb935:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)QVar4.i;
}

Assistant:

QGestureRecognizer::Result QPanGestureRecognizer::recognize(QGesture *state,
                                                            QObject *,
                                                            QEvent *event)
{
    QPanGesture *q = static_cast<QPanGesture *>(state);
    QPanGesturePrivate *d = q->d_func();

    QGestureRecognizer::Result result = QGestureRecognizer::Ignore;
    switch (event->type()) {
    case QEvent::TouchBegin: {
        result = QGestureRecognizer::MayBeGesture;
        d->lastOffset = d->offset = QPointF();
        d->pointCount = m_pointCount;
        break;
    }
    case QEvent::TouchEnd: {
        if (q->state() != Qt::NoGesture) {
            const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
            if (ev->points().size() == d->pointCount) {
                d->lastOffset = d->offset;
                d->offset = panOffset(ev->points(), d->pointCount);
            }
            result = QGestureRecognizer::FinishGesture;
        } else {
            result = QGestureRecognizer::CancelGesture;
        }
        break;
    }
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (ev->points().size() >= d->pointCount) {
            d->lastOffset = d->offset;
            d->offset = panOffset(ev->points(), d->pointCount);
            if (d->offset.x() > 10  || d->offset.y() > 10 ||
                d->offset.x() < -10 || d->offset.y() < -10) {
                q->setHotSpot(ev->points().first().globalPressPosition());
                result = QGestureRecognizer::TriggerGesture;
            } else {
                result = QGestureRecognizer::MayBeGesture;
            }
        }
        break;
    }
    default:
        break;
    }
    return result;
}